

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EmissionSystem::Decode(EmissionSystem *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  EmitterBeam local_d0;
  byte local_4e;
  undefined1 local_4d;
  KUINT8 i;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  EmissionSystem *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x14) {
    local_4d = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    local_4d = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,&this->m_ui8SystemDataLength);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8NumberOfBeams);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding);
  pKVar2 = operator>>(pKVar2,&(this->m_EmitterSystemRecord).super_DataTypeBase);
  operator>>(pKVar2,&(this->m_Location).super_DataTypeBase);
  for (local_4e = 0; local_4e < this->m_ui8NumberOfBeams; local_4e = local_4e + 1) {
    EmitterBeam::EmitterBeam(&local_d0,local_18);
    std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::
    push_back(&this->m_vEmitterBeams,&local_d0);
    EmitterBeam::~EmitterBeam(&local_d0);
  }
  return;
}

Assistant:

void EmissionSystem::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < EMISSION_SYSTEM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8SystemDataLength
           >> m_ui8NumberOfBeams
           >> m_ui16Padding
           >> KDIS_STREAM m_EmitterSystemRecord
           >> KDIS_STREAM m_Location;

    for( KUINT8 i = 0; i < m_ui8NumberOfBeams; ++i )
    {
        m_vEmitterBeams.push_back( EmitterBeam( stream ) );
    }
}